

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O0

WeightedDomainEnsemble * __thiscall
MatryoshkaDAG::extractTopK(MatryoshkaDAG *this,float areaCovered)

{
  reference pvVar1;
  reference pvVar2;
  long *in_RSI;
  WeightedDomainEnsemble *in_RDI;
  float in_stack_0000001c;
  size_t in_stack_00000020;
  MatryoshkaDAG *in_stack_00000028;
  size_t i;
  WeightedDomainEnsemble *ensemble;
  value_type *in_stack_ffffffffffffff78;
  WeightedDomainEnsemble *in_stack_ffffffffffffff80;
  WeightedDomainEnsemble *this_00;
  ulong local_20;
  
  WeightedDomainEnsemble::WeightedDomainEnsemble(in_stack_ffffffffffffff80);
  for (local_20 = 0; local_20 < *(ulong *)(*in_RSI + 0x38); local_20 = local_20 + 1) {
    this_00 = in_RDI;
    extractDomains(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
    std::
    vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
    ::push_back(&in_stack_ffffffffffffff80->domainSets,in_stack_ffffffffffffff78);
    std::vector<Domain,_std::allocator<Domain>_>::~vector
              ((vector<Domain,_std::allocator<Domain>_> *)this_00);
    in_stack_ffffffffffffff78 = (value_type *)(in_RSI + 5);
    pvVar1 = std::
             vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
             ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                           *)in_stack_ffffffffffffff78,*(size_type *)(*in_RSI + 0x30));
    pvVar2 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
             operator[](pvVar1,local_20);
    in_stack_ffffffffffffff80 = (WeightedDomainEnsemble *)pvVar2->score;
    pvVar1 = std::
             vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
             ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                           *)in_stack_ffffffffffffff78,*(size_type *)(*in_RSI + 0x30));
    std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::operator[]
              (pvVar1,0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
               (value_type_conflict *)in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

WeightedDomainEnsemble MatryoshkaDAG::extractTopK(float areaCovered) {
    WeightedDomainEnsemble ensemble;

    for (size_t i = 0; i < params->K; i++) { 
        ensemble.domainSets.push_back( extractDomains(i, areaCovered) );
        ensemble.weights.push_back( OPT[params->n][i].score/OPT[params->n][0].score );
    }

    return ensemble;
}